

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O3

int GetCode(gif_source_ptr sinfo)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  j_compress_ptr pjVar5;
  jpeg_error_mgr *pjVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  iVar9 = sinfo->cur_bit;
  iVar10 = sinfo->code_size;
  iVar7 = iVar10 + iVar9;
  if (sinfo->last_bit < iVar7) {
    do {
      if (sinfo->first_time != 0) {
        sinfo->first_time = 0;
        return sinfo->clear_code;
      }
      if (sinfo->out_of_blocks != 0) {
LAB_001040a5:
        pjVar5 = sinfo->cinfo;
        pjVar6 = pjVar5->err;
        pjVar6->msg_code = 0x403;
        (*pjVar6->emit_message)((j_common_ptr)pjVar5,-1);
        return sinfo->end_code;
      }
      sinfo->code_buf[0] = sinfo->code_buf[(long)sinfo->last_byte + -2];
      sinfo->code_buf[1] = sinfo->code_buf[(long)sinfo->last_byte + -1];
      iVar7 = GetDataBlock(sinfo,sinfo->code_buf + 2);
      if (iVar7 == 0) {
        sinfo->out_of_blocks = 1;
        goto LAB_001040a5;
      }
      iVar10 = sinfo->code_size;
      iVar11 = sinfo->cur_bit - sinfo->last_bit;
      iVar9 = iVar11 + 0x10;
      sinfo->cur_bit = iVar9;
      sinfo->last_byte = iVar7 + 2;
      iVar1 = iVar7 * 8 + 0x10;
      sinfo->last_bit = iVar1;
      iVar7 = iVar11 + iVar10 + 0x10;
    } while (iVar1 < iVar7);
  }
  lVar8 = (long)(iVar9 >> 3);
  bVar2 = sinfo->code_buf[lVar8 + 2];
  bVar3 = sinfo->code_buf[lVar8 + 1];
  bVar4 = sinfo->code_buf[lVar8];
  sinfo->cur_bit = iVar7;
  return ~(-1 << ((byte)iVar10 & 0x1f)) &
         ((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10) >> ((byte)iVar9 & 7);
}

Assistant:

LOCAL(int)
GetCode(gif_source_ptr sinfo)
/* Fetch the next code_size bits from the GIF data */
/* We assume code_size is less than 16 */
{
  register int accum;
  int offs, count;

  while (sinfo->cur_bit + sinfo->code_size > sinfo->last_bit) {
    /* Time to reload the buffer */
    /* First time, share code with Clear case */
    if (sinfo->first_time) {
      sinfo->first_time = FALSE;
      return sinfo->clear_code;
    }
    if (sinfo->out_of_blocks) {
      WARNMS(sinfo->cinfo, JWRN_GIF_NOMOREDATA);
      return sinfo->end_code;   /* fake something useful */
    }
    /* preserve last two bytes of what we have -- assume code_size <= 16 */
    sinfo->code_buf[0] = sinfo->code_buf[sinfo->last_byte-2];
    sinfo->code_buf[1] = sinfo->code_buf[sinfo->last_byte-1];
    /* Load more bytes; set flag if we reach the terminator block */
    if ((count = GetDataBlock(sinfo, &sinfo->code_buf[2])) == 0) {
      sinfo->out_of_blocks = TRUE;
      WARNMS(sinfo->cinfo, JWRN_GIF_NOMOREDATA);
      return sinfo->end_code;   /* fake something useful */
    }
    /* Reset counters */
    sinfo->cur_bit = (sinfo->cur_bit - sinfo->last_bit) + 16;
    sinfo->last_byte = 2 + count;
    sinfo->last_bit = sinfo->last_byte * 8;
  }

  /* Form up next 24 bits in accum */
  offs = sinfo->cur_bit >> 3;   /* byte containing cur_bit */
  accum = UCH(sinfo->code_buf[offs + 2]);
  accum <<= 8;
  accum |= UCH(sinfo->code_buf[offs + 1]);
  accum <<= 8;
  accum |= UCH(sinfo->code_buf[offs]);

  /* Right-align cur_bit in accum, then mask off desired number of bits */
  accum >>= (sinfo->cur_bit & 7);
  sinfo->cur_bit += sinfo->code_size;
  return accum & ((1 << sinfo->code_size) - 1);
}